

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
IntrusiveListIteratorTest_begin_end_backward_Test::TestBody
          (IntrusiveListIteratorTest_begin_end_backward_Test *this)

{
  TestObject *pTVar1;
  IntrusiveListIteratorTest *pIVar2;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  undefined8 *puVar6;
  char *pcVar7;
  vector<int,_std::allocator<int>_> *in_R9;
  TestObject *pTVar8;
  const_iterator first;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  unsigned_long local_70;
  undefined8 *local_68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  IntrusiveListIteratorTest_begin_end_backward_Test *local_48;
  undefined8 *local_40;
  AssertHelper local_38;
  
  pTVar1 = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_48 = this;
  local_40 = (undefined8 *)operator_new(0xc);
  *local_40 = 0x200000003;
  *(undefined4 *)(local_40 + 1) = 1;
  local_70 = 0;
  if (pTVar1 != (TestObject *)0x0) {
    pIVar2 = &local_48->super_IntrusiveListIteratorTest;
    pTVar8 = (TestObject *)0x0;
    do {
      if (pTVar8 == (TestObject *)0x0) {
        pTVar8 = (TestObject *)&pIVar2->list_;
      }
      pTVar8 = (pTVar8->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
      if (pTVar8 == (TestObject *)0x0) {
        __assert_fail("node_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                      ,0xa0,
                      "pointer wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator->() const [T = (anonymous namespace)::TestObject]"
                     );
      }
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_68,"expected[count]","last->data",
                 (int *)((long)local_40 + local_70 * 4),&pTVar8->data);
      if (local_68._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_78);
        if (sStack_60.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = ((sStack_60.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                   ,0xae,pcVar7);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) &&
             (local_78.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_78.ptr_ + 8))();
          }
          local_78.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&sStack_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        goto LAB_001e5514;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_70 = local_70 + 1;
    } while (pTVar8 != pTVar1);
  }
  local_78.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_68,"count","expected.size()",&local_70,(unsigned_long *)&local_78);
  if (local_68._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (sStack_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((sStack_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
               ,0xb1,pcVar7);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_78.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) &&
         (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_78.ptr_ + 8))();
      }
      local_78.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_001e5514:
  operator_delete(local_40);
  pIVar2 = (IntrusiveListIteratorTest *)(local_48->super_IntrusiveListIteratorTest).clist_;
  piVar3 = (intrusive_list<(anonymous_namespace)::TestObject> *)
           (pIVar2->super_IntrusiveListTest).super_Test._vptr_Test;
  local_68 = (undefined8 *)0x0;
  sStack_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  puVar6 = (undefined8 *)operator_new(0xc);
  sStack_60.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)puVar6 + 0xc);
  *puVar6 = 0x200000003;
  *(undefined4 *)(puVar6 + 1) = 1;
  first.node_ = (TestObject *)pIVar2;
  first.list_ = piVar3;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = &local_68;
  local_68 = puVar6;
  local_58 = sStack_60.ptr_;
  anon_unknown.dwarf_7c624::IntrusiveListIteratorTest::
  TestBackward<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
            (pIVar2,first,(const_iterator)(auVar4 << 0x40),in_R9);
  operator_delete(puVar6);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, begin_end_backward) {
  TestBackward(list_.begin(), list_.end(), {3, 2, 1});
  TestBackward(clist_.begin(), clist_.end(), {3, 2, 1});
}